

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  int *piVar6;
  Layer *pLVar7;
  undefined4 *puVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  int iVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  byte bVar36;
  undefined7 uVar38;
  Option *pOVar37;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  Option *_elemsize;
  void *pvVar42;
  uint _w;
  bool bVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  float fVar46;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar52;
  float fVar60;
  float fVar61;
  undefined1 auVar53 [16];
  float fVar62;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  uint local_250;
  ulong local_228;
  undefined1 local_208 [40];
  undefined1 auStack_1e0 [16];
  ulong uStack_1d0;
  size_t local_1c8;
  Mat local_1b8;
  undefined1 local_168 [40];
  undefined1 local_140 [16];
  int local_130;
  size_t local_128;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Allocator *local_108;
  int local_100;
  Allocator *local_f8;
  undefined1 local_f0 [16];
  int local_e0;
  ulong local_d8;
  pointer local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  pointer local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined1 local_a0 [16];
  int local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar23 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar23;
  }
  uVar25 = bottom_blob->c;
  uVar40 = bottom_blob->elemsize;
  iVar23 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar41 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar30 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar27 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar24 = bottom_blob->elempack;
  local_1b8.cstep = 0;
  local_1b8.data = (pointer)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_1b8,opt);
  iVar21 = local_1b8.w;
  iVar29 = -100;
  if (((pointer)local_1b8.data == (pointer)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
  goto LAB_0041a355;
  iVar23 = (~((iVar23 + -1) * iVar41) + local_1b8.w) / (this->super_ConvolutionDepthWise).stride_w;
  _w = iVar23 + 1;
  iVar41 = (~((iVar30 + -1) * iVar27) + local_1b8.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar39 = 1;
  if (opt->use_packing_layout == true) {
    uVar33 = (this->super_ConvolutionDepthWise).num_output;
    uVar39 = 8;
    if ((uVar33 & 7) != 0) {
      uVar39 = (ulong)((uVar33 & 3) == 0) * 3 + 1;
    }
  }
  uVar33 = (uint)uVar39;
  _elemsize = (Option *)((uVar40 / (ulong)(long)iVar24) * uVar39);
  pOVar37 = _elemsize;
  Mat::create(top_blob,_w,iVar41 + 1,(this->super_ConvolutionDepthWise).num_output / (int)uVar33,
              (size_t)_elemsize,uVar33,opt->blob_allocator);
  iVar29 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0041a355;
  iVar30 = (this->super_ConvolutionDepthWise).num_output;
  iVar27 = (this->super_ConvolutionDepthWise).group;
  if (iVar27 != iVar30 || iVar24 * uVar25 != iVar27) {
LAB_0041911a:
    uVar25 = (int)(iVar24 * uVar25) / iVar27;
    uVar26 = iVar30 / iVar27;
    iVar23 = 1;
    local_250 = 1;
    if (opt->use_packing_layout == true) {
      iVar23 = (uint)((uVar25 & 3) == 0) * 3 + 1;
      if ((uVar25 & 7) == 0) {
        iVar23 = 8;
      }
      local_250 = (uint)((uVar26 & 3) == 0) * 3 + 1;
      if ((uVar26 & 7) == 0) {
        local_250 = 8;
      }
    }
    piVar6 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    local_168._0_8_ = local_1b8.data;
    local_168._8_4_ = local_1b8.refcount._0_4_;
    local_168._12_4_ = local_1b8.refcount._4_4_;
    local_168._16_8_ = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
    local_168._24_4_ = local_1b8.elempack;
    local_168._32_8_ = local_1b8.allocator;
    local_140._4_4_ = local_1b8.w;
    local_140._0_4_ = local_1b8.dims;
    local_140._12_4_ = local_1b8.d;
    local_140._8_4_ = local_1b8.h;
    local_130 = local_1b8.c;
    local_128 = local_1b8.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    if (iVar23 < iVar24) {
      local_208._0_8_ = *(undefined8 *)opt;
      local_208._16_8_ = opt->workspace_allocator;
      uVar13 = opt->openmp_blocktime;
      uVar14 = opt->use_winograd_convolution;
      uVar16 = opt->use_sgemm_convolution;
      uVar18 = opt->use_int8_inference;
      uVar20 = opt->use_vulkan_compute;
      uVar19 = CONCAT11(uVar20,uVar18);
      uVar17 = CONCAT21(uVar19,uVar16);
      uVar15 = CONCAT31(uVar17,uVar14);
      local_208._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
      auStack_1e0._0_4_ = opt->vulkan_device_index;
      auStack_1e0[4] = opt->use_reserved_1;
      auStack_1e0[5] = opt->use_image_storage;
      auStack_1e0[6] = opt->use_tensor_storage;
      auStack_1e0[7] = opt->use_reserved_2;
      auStack_1e0._8_4_ = opt->flush_denormals;
      auStack_1e0[0xc] = opt->use_local_pool_allocator;
      auStack_1e0[0xd] = opt->use_shader_local_memory;
      auStack_1e0[0xe] = opt->use_cooperative_matrix;
      auStack_1e0[0xf] = opt->use_winograd23_convolution;
      uStack_1d0._0_1_ = opt->use_winograd43_convolution;
      uStack_1d0._1_1_ = opt->use_winograd63_convolution;
      uStack_1d0._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_1d0._3_1_ = opt->use_fp16_uniform;
      uStack_1d0._4_1_ = opt->use_int8_uniform;
      uStack_1d0._5_1_ = opt->use_reserved_9;
      uStack_1d0._6_1_ = opt->use_reserved_10;
      uStack_1d0._7_1_ = opt->use_reserved_11;
      local_208._8_4_ = SUB84(opt->workspace_allocator,0);
      local_208._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_208._24_4_ = uVar13;
      local_208._28_4_ = uVar15;
      convert_packing(&local_1b8,(Mat *)local_168,iVar23,(Option *)local_208);
      if (((pointer)local_168._0_8_ != (pointer)0x0) && ((long)local_130 * local_128 != 0))
      goto LAB_0041927b;
      iVar29 = -100;
    }
    else {
LAB_0041927b:
      piVar6 = top_blob->refcount;
      local_208._0_8_ = top_blob->data;
      local_208._8_4_ = SUB84(top_blob->refcount,0);
      local_208._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_208._16_8_ = top_blob->elemsize;
      local_208._24_4_ = top_blob->elempack;
      local_208._32_8_ = top_blob->allocator;
      auStack_1e0._0_4_ = top_blob->dims;
      auStack_1e0._4_4_ = top_blob->w;
      auStack_1e0._8_4_ = top_blob->h;
      auStack_1e0._12_4_ = top_blob->d;
      uStack_1d0 = CONCAT44(uStack_1d0._4_4_,top_blob->c);
      local_1c8 = top_blob->cstep;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      if (local_250 < uVar33) {
        Mat::create((Mat *)local_208,_w,iVar41 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)local_250,
                    (ulong)local_250 * ((ulong)_elemsize / uVar39),local_250,
                    opt->workspace_allocator);
        iVar29 = -100;
        if (((void *)local_208._0_8_ != (void *)0x0) && ((long)(int)uStack_1d0 * local_1c8 != 0))
        goto LAB_0041934f;
      }
      else {
LAB_0041934f:
        iVar41 = (this->super_ConvolutionDepthWise).group;
        bVar43 = 0 < iVar41;
        if (iVar41 < 1) {
          iVar29 = -100;
        }
        else {
          iVar29 = -100;
          iVar41 = 0;
          iVar30 = 0;
          lVar35 = 0;
          do {
            local_c8 = (pointer)((long)(iVar41 / iVar23) * local_128 * local_168._16_8_ +
                                local_168._0_8_);
            uStack_c0 = 0;
            uStack_bc = 0;
            local_b8 = (pointer)local_168._16_8_;
            local_b0 = local_168._24_4_;
            local_a8 = (Allocator *)local_168._32_8_;
            local_88 = ((long)(int)local_140._12_4_ * local_168._16_8_ *
                        (long)(int)local_140._8_4_ * (long)(int)local_140._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_168._16_8_;
            local_a0 = local_140;
            local_118 = (void *)((long)(iVar30 / (int)local_250) * local_1c8 * local_208._16_8_ +
                                local_208._0_8_);
            uStack_110 = 0;
            uStack_10c = 0;
            local_108 = (Allocator *)local_208._16_8_;
            local_100 = local_208._24_4_;
            local_f8 = (Allocator *)local_208._32_8_;
            local_d8 = ((long)(int)auStack_1e0._12_4_ * local_208._16_8_ *
                        (long)(int)auStack_1e0._8_4_ * (long)(int)auStack_1e0._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_f0 = auStack_1e0;
            pLVar7 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar35];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = (Allocator *)local_208._32_8_;
            local_e0 = (int)uVar26 / (int)local_250;
            local_90 = (int)uVar25 / iVar23;
            iVar27 = (*pLVar7->_vptr_Layer[7])(pLVar7,&local_c8,&local_118,&local_78);
            if (iVar27 != 0) {
              iVar29 = iVar27;
            }
            piVar6 = (int *)CONCAT44(uStack_10c,uStack_110);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (local_118 != (void *)0x0) {
                    free(local_118);
                  }
                }
                else {
                  (**(code **)(*(long *)local_f8 + 0x18))();
                }
              }
            }
            local_d8 = 0;
            local_118 = (void *)0x0;
            uStack_110 = 0;
            uStack_10c = 0;
            local_108 = (Allocator *)0x0;
            local_100 = 0;
            local_f0 = (undefined1  [16])0x0;
            local_e0 = 0;
            piVar6 = (int *)CONCAT44(uStack_bc,uStack_c0);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_a8 == (Allocator *)0x0) {
                  if (local_c8 != (pointer)0x0) {
                    free(local_c8);
                  }
                }
                else {
                  (**(code **)(*(long *)local_a8 + 0x18))();
                }
              }
            }
            local_88 = 0;
            local_c8 = (pointer)0x0;
            uStack_c0 = 0;
            uStack_bc = 0;
            local_b8 = (pointer)0x0;
            local_b0 = 0;
            local_a0 = (undefined1  [16])0x0;
            local_90 = 0;
            if (iVar27 != 0) break;
            lVar35 = lVar35 + 1;
            lVar28 = (long)(this->super_ConvolutionDepthWise).group;
            iVar30 = iVar30 + uVar26;
            iVar41 = iVar41 + uVar25;
            bVar43 = lVar35 < lVar28;
          } while (lVar35 < lVar28);
        }
        if (!bVar43) {
          if (local_250 < uVar33) {
            convert_packing((Mat *)local_208,top_blob,uVar33,opt);
            iVar29 = -100;
            if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
            goto LAB_0041a277;
          }
          else if ((Mat *)local_208 != top_blob) {
            piVar6 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = top_blob->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            auVar75 = auStack_1e0;
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = (void *)local_208._0_8_;
            top_blob->refcount = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            top_blob->elemsize = local_208._16_8_;
            top_blob->elempack = local_208._24_4_;
            top_blob->allocator = (Allocator *)local_208._32_8_;
            top_blob->dims = auStack_1e0._0_4_;
            top_blob->w = auStack_1e0._4_4_;
            top_blob->h = auStack_1e0._8_4_;
            top_blob->d = auStack_1e0._12_4_;
            top_blob->c = (int)uStack_1d0;
            top_blob->cstep = local_1c8;
            auStack_1e0 = auVar75;
          }
          iVar29 = 0;
        }
      }
LAB_0041a277:
      piVar6 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_208._32_8_ + 0x18))();
          }
        }
      }
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      local_208._12_4_ = 0;
      local_208._16_8_ = (Allocator *)0x0;
      local_208._24_4_ = 0;
      auStack_1e0 = (undefined1  [16])0x0;
      uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
    }
    piVar6 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((Allocator *)local_168._32_8_ == (Allocator *)0x0) {
          if ((pointer)local_168._0_8_ != (pointer)0x0) {
            free((void *)local_168._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_168._32_8_ + 0x18))();
        }
      }
    }
    local_128 = 0;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_4_ = 0;
    local_168._12_4_ = 0;
    local_168._16_8_ = (pointer)0x0;
    local_168._24_4_ = 0;
    local_140 = (undefined1  [16])0x0;
    local_130 = 0;
    goto LAB_0041a355;
  }
  if (iVar24 == 1) {
    auVar75._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar75._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar75._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar75._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar75 = vpcmpeqd_avx(auVar75,_DAT_005e3980);
    uVar31 = vmovmskps_avx(auVar75);
    iVar23 = (this->super_ConvolutionDepthWise).stride_w;
    uVar26 = (this->super_ConvolutionDepthWise).stride_h;
    if (uVar26 == 1 && (iVar23 == 1 && (uVar31 ^ 0xf) == 0)) {
      convdw3x3s1_sse(&local_1b8,top_blob,&this->weight_data_tm,
                      &(this->super_ConvolutionDepthWise).bias_data,(Option *)(ulong)uVar26);
    }
    else {
      bVar43 = (char)(uVar31 ^ 0xf) == '\0';
      if ((uVar26 != 2 || iVar23 != 2) || !bVar43) goto LAB_0041911a;
      convdw3x3s2_sse(&local_1b8,top_blob,&this->weight_data_tm,
                      &(this->super_ConvolutionDepthWise).bias_data,
                      (Option *)
                      (ulong)CONCAT31((int3)(uVar26 >> 8),(uVar26 == 2 && iVar23 == 2) && bVar43));
    }
LAB_004198e8:
    pLVar7 = this->activation;
    if (pLVar7 != (Layer *)0x0) {
      (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
    }
  }
  else {
    uVar38 = (undefined7)((ulong)pOVar37 >> 8);
    if (iVar24 != 4) {
      if (iVar24 != 8) goto LAB_0041911a;
      auVar84._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar84._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar84._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar84._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      auVar75 = vpcmpeqd_avx(auVar84,_DAT_005e3980);
      iVar24 = vmovmskps_avx(auVar75);
      iVar30 = (this->super_ConvolutionDepthWise).stride_w;
      iVar27 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar27 == 1 && (iVar30 == 1 && iVar24 == 0xf)) {
        convdw3x3s1_pack8_avx
                  (&local_1b8,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,pOVar37);
      }
      else {
        bVar22 = (byte)iVar24;
        if ((iVar27 == 2 && iVar30 == 2) && bVar22 == 0xf) {
          convdw3x3s2_pack8_avx
                    (&local_1b8,top_blob,&this->weight_data_tm,
                     &(this->super_ConvolutionDepthWise).bias_data,
                     (Option *)CONCAT71(uVar38,(iVar27 == 2 && iVar30 == 2) && bVar22 == 0xf));
        }
        else {
          bVar22 = bVar22 >> 2 & bVar22 >> 3 & (auVar84._4_4_ == 5 && auVar84._0_4_ == 5);
          bVar36 = (iVar30 == 1 && iVar27 == 1) & bVar22;
          pOVar37 = (Option *)CONCAT71(uVar38,bVar36);
          if (bVar36 == 1) {
            convdw5x5s1_pack8_avx
                      (&local_1b8,top_blob,&this->weight_data_tm,
                       &(this->super_ConvolutionDepthWise).bias_data,pOVar37);
          }
          else {
            if ((bVar22 & (iVar30 == 2 && iVar27 == 2)) != 1) {
              uVar33 = auVar84._4_4_ * auVar84._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_168,(long)(int)uVar33,
                         (allocator_type *)local_208);
              if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
                iVar30 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar27 = (this->super_ConvolutionDepthWise).dilation_w;
                iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar29 = 0;
                iVar32 = 0;
                iVar34 = 0;
                do {
                  if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                    lVar35 = 0;
                    do {
                      *(int *)(local_168._0_8_ + (iVar29 + lVar35) * 4) = iVar32;
                      iVar32 = iVar32 + (this->super_ConvolutionDepthWise).dilation_w;
                      lVar35 = lVar35 + 1;
                    } while ((int)lVar35 < (this->super_ConvolutionDepthWise).kernel_w);
                    iVar29 = iVar29 + (int)lVar35;
                  }
                  iVar32 = iVar32 + (iVar21 * iVar30 - iVar27 * iVar24);
                  iVar34 = iVar34 + 1;
                } while (iVar34 < (this->super_ConvolutionDepthWise).kernel_h);
              }
              if (0 < (int)uVar25) {
                iVar30 = 0;
                local_228 = 0;
                do {
                  if (-1 < iVar41) {
                    pvVar42 = (void *)(top_blob->cstep * local_228 * top_blob->elemsize +
                                      (long)top_blob->data);
                    pvVar9 = (this->weight_data_tm).data;
                    iVar27 = 0;
                    do {
                      if (-1 < iVar23) {
                        uVar40 = 0;
                        do {
                          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                            auVar45 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            auVar45 = ZEXT3264(*(undefined1 (*) [32])
                                                ((long)(this->super_ConvolutionDepthWise).bias_data.
                                                       data + local_228 * 0x20));
                          }
                          auVar44 = auVar45._0_32_;
                          if (0 < (int)uVar33) {
                            lVar35 = 0;
                            do {
                              pfVar1 = (float *)((long)pvVar9 + lVar35 * 8 + (long)iVar30 * 4);
                              pfVar2 = (float *)((long)local_1b8.data +
                                                (long)*(int *)(local_168._0_8_ + lVar35) * 0x20 +
                                                (long)((this->super_ConvolutionDepthWise).stride_w *
                                                       (int)uVar40 * 8) * 4 +
                                                (long)(this->super_ConvolutionDepthWise).stride_h *
                                                (long)iVar27 *
                                                (long)local_1b8.w *
                                                CONCAT44(local_1b8.elemsize._4_4_,
                                                         (undefined4)local_1b8.elemsize) +
                                                local_1b8.cstep * local_228 *
                                                CONCAT44(local_1b8.elemsize._4_4_,
                                                         (undefined4)local_1b8.elemsize));
                              auVar44._0_4_ = *pfVar1 * *pfVar2 + auVar45._0_4_;
                              auVar44._4_4_ = pfVar1[1] * pfVar2[1] + auVar45._4_4_;
                              auVar44._8_4_ = pfVar1[2] * pfVar2[2] + auVar45._8_4_;
                              auVar44._12_4_ = pfVar1[3] * pfVar2[3] + auVar45._12_4_;
                              auVar44._16_4_ = pfVar1[4] * pfVar2[4] + auVar45._16_4_;
                              auVar44._20_4_ = pfVar1[5] * pfVar2[5] + auVar45._20_4_;
                              auVar44._24_4_ = pfVar1[6] * pfVar2[6] + auVar45._24_4_;
                              auVar44._28_4_ = pfVar1[7] + auVar45._28_4_;
                              auVar45 = ZEXT3264(auVar44);
                              lVar35 = lVar35 + 4;
                            } while ((ulong)uVar33 << 2 != lVar35);
                          }
                          *(undefined1 (*) [32])((long)pvVar42 + uVar40 * 0x20) = auVar44;
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != _w);
                      }
                      pvVar42 = (void *)((long)pvVar42 + (long)(int)(_w * 8) * 4);
                      bVar43 = iVar27 != iVar41;
                      iVar27 = iVar27 + 1;
                    } while (bVar43);
                  }
                  local_228 = local_228 + 1;
                  iVar30 = iVar30 + uVar33 * 8;
                } while (local_228 != uVar25);
              }
              pLVar7 = this->activation;
              if (pLVar7 != (Layer *)0x0) {
                (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
              }
              goto LAB_0041a1c6;
            }
            convdw5x5s2_pack8_avx
                      (&local_1b8,top_blob,&this->weight_data_tm,
                       &(this->super_ConvolutionDepthWise).bias_data,pOVar37);
          }
        }
      }
      goto LAB_004198e8;
    }
    auVar12._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar12._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar12._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar12._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar75 = vpcmpeqd_avx(auVar12,_DAT_005e3980);
    iVar24 = vmovmskps_avx(auVar75);
    iVar30 = (this->super_ConvolutionDepthWise).stride_w;
    iVar27 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar27 == 1 && (iVar30 == 1 && iVar24 == 0xf)) {
      convdw3x3s1_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar37);
      goto LAB_004198e8;
    }
    bVar22 = (byte)iVar24;
    if ((iVar27 == 2 && iVar30 == 2) && bVar22 == 0xf) {
      convdw3x3s2_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,
                 (Option *)CONCAT71(uVar38,(iVar27 == 2 && iVar30 == 2) && bVar22 == 0xf));
      goto LAB_004198e8;
    }
    bVar22 = bVar22 >> 2 & bVar22 >> 3 & (auVar12._4_4_ == 5 && auVar12._0_4_ == 5);
    bVar36 = (iVar30 == 1 && iVar27 == 1) & bVar22;
    pOVar37 = (Option *)CONCAT71(uVar38,bVar36);
    if (bVar36 == 1) {
      convdw5x5s1_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar37);
      goto LAB_004198e8;
    }
    if ((bVar22 & (iVar30 == 2 && iVar27 == 2)) == 1) {
      convdw5x5s2_pack4_sse
                (&local_1b8,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar37);
      goto LAB_004198e8;
    }
    uVar33 = auVar12._4_4_ * auVar12._0_4_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,(long)(int)uVar33,
               (allocator_type *)local_208);
    if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
      iVar30 = (this->super_ConvolutionDepthWise).dilation_h;
      iVar27 = (this->super_ConvolutionDepthWise).dilation_w;
      iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar29 = 0;
      iVar32 = 0;
      iVar34 = 0;
      do {
        if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
          lVar35 = 0;
          do {
            *(int *)(local_168._0_8_ + (iVar34 + lVar35) * 4) = iVar32;
            iVar32 = iVar32 + (this->super_ConvolutionDepthWise).dilation_w;
            lVar35 = lVar35 + 1;
          } while ((int)lVar35 < (this->super_ConvolutionDepthWise).kernel_w);
          iVar34 = iVar34 + (int)lVar35;
        }
        iVar32 = iVar32 + (iVar21 * iVar30 - iVar27 * iVar24);
        iVar29 = iVar29 + 1;
      } while (iVar29 < (this->super_ConvolutionDepthWise).kernel_h);
    }
    if (0 < (int)uVar25) {
      iVar30 = 0;
      auVar45 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      local_228 = 0;
      do {
        if (-1 < iVar41) {
          pvVar42 = (void *)(top_blob->cstep * local_228 * top_blob->elemsize + (long)top_blob->data
                            );
          pvVar9 = (this->weight_data_tm).data;
          iVar27 = 0;
          do {
            if (-1 < iVar23) {
              uVar40 = 0;
              do {
                if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                  auVar47 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar47 = *(undefined1 (*) [16])
                             ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                             local_228 * 0x10);
                }
                if (0 < (int)uVar33) {
                  lVar35 = 0;
                  auVar75 = auVar47;
                  do {
                    pfVar1 = (float *)((long)pvVar9 + lVar35 * 4 + (long)iVar30 * 4);
                    pfVar2 = (float *)((long)local_1b8.data +
                                      (long)*(int *)(local_168._0_8_ + lVar35) * 0x10 +
                                      (long)((this->super_ConvolutionDepthWise).stride_w *
                                             (int)uVar40 * 4) * 4 +
                                      (long)(this->super_ConvolutionDepthWise).stride_h *
                                      (long)iVar27 *
                                      (long)local_1b8.w *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize) +
                                      local_1b8.cstep * local_228 *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize));
                    auVar47._0_4_ = *pfVar1 * *pfVar2 + auVar75._0_4_;
                    auVar47._4_4_ = pfVar1[1] * pfVar2[1] + auVar75._4_4_;
                    auVar47._8_4_ = pfVar1[2] * pfVar2[2] + auVar75._8_4_;
                    auVar47._12_4_ = pfVar1[3] * pfVar2[3] + auVar75._12_4_;
                    lVar35 = lVar35 + 4;
                    auVar75 = auVar47;
                  } while ((ulong)uVar33 << 2 != lVar35);
                }
                fVar4 = auVar45._0_4_;
                fVar5 = auVar45._4_4_;
                fVar10 = auVar45._8_4_;
                fVar11 = auVar45._12_4_;
                fVar46 = auVar47._4_4_;
                fVar50 = auVar47._8_4_;
                fVar51 = auVar47._12_4_;
                switch((this->super_ConvolutionDepthWise).activation_type) {
                case 1:
                  auVar47 = vmaxps_avx(auVar47,_DAT_005e2030);
                  break;
                case 2:
                  auVar75 = vmaxps_avx(auVar47,(undefined1  [16])0x0);
                  auVar84 = vminps_avx(auVar47,(undefined1  [16])0x0);
                  fVar4 = *(this->super_ConvolutionDepthWise).activation_params.data;
                  auVar47._0_4_ = fVar4 * auVar84._0_4_ + auVar75._0_4_;
                  auVar47._4_4_ = fVar4 * auVar84._4_4_ + auVar75._4_4_;
                  auVar47._8_4_ = fVar4 * auVar84._8_4_ + auVar75._8_4_;
                  auVar47._12_4_ = fVar4 * auVar84._12_4_ + auVar75._12_4_;
                  break;
                case 3:
                  puVar8 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar3 = *puVar8;
                  auVar79._4_4_ = uVar3;
                  auVar79._0_4_ = uVar3;
                  auVar79._8_4_ = uVar3;
                  auVar79._12_4_ = uVar3;
                  uVar3 = puVar8[1];
                  auVar87._4_4_ = uVar3;
                  auVar87._0_4_ = uVar3;
                  auVar87._8_4_ = uVar3;
                  auVar87._12_4_ = uVar3;
                  auVar75 = vmaxps_avx(auVar47,auVar79);
                  auVar47 = vminps_avx(auVar87,auVar75);
                  break;
                case 4:
                  auVar48._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
                  auVar48._8_4_ = -fVar50;
                  auVar48._12_4_ = -fVar51;
                  auVar57._8_4_ = 0x42b0c0a5;
                  auVar57._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar57._12_4_ = 0x42b0c0a5;
                  auVar75 = vminps_avx(auVar48,auVar57);
                  auVar58._8_4_ = 0xc2b0c0a5;
                  auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar58._12_4_ = 0xc2b0c0a5;
                  auVar12 = vmaxps_avx(auVar75,auVar58);
                  auVar80._0_4_ = fVar4 + auVar12._0_4_ * 1.442695;
                  auVar80._4_4_ = fVar5 + auVar12._4_4_ * 1.442695;
                  auVar80._8_4_ = fVar10 + auVar12._8_4_ * 1.442695;
                  auVar80._12_4_ = fVar11 + auVar12._12_4_ * 1.442695;
                  auVar88._0_4_ = (int)auVar80._0_4_;
                  auVar88._4_4_ = (int)auVar80._4_4_;
                  auVar88._8_4_ = (int)auVar80._8_4_;
                  auVar88._12_4_ = (int)auVar80._12_4_;
                  auVar84 = vcvtdq2ps_avx(auVar88);
                  auVar75 = vcmpps_avx(auVar80,auVar84,1);
                  auVar75 = vandps_avx(auVar75,auVar73);
                  auVar75 = vsubps_avx(auVar84,auVar75);
                  fVar46 = auVar75._0_4_ * -0.6931472 + auVar12._0_4_;
                  fVar50 = auVar75._4_4_ * -0.6931472 + auVar12._4_4_;
                  fVar51 = auVar75._8_4_ * -0.6931472 + auVar12._8_4_;
                  fVar52 = auVar75._12_4_ * -0.6931472 + auVar12._12_4_;
                  auVar81._0_4_ = (int)auVar75._0_4_;
                  auVar81._4_4_ = (int)auVar75._4_4_;
                  auVar81._8_4_ = (int)auVar75._8_4_;
                  auVar81._12_4_ = (int)auVar75._12_4_;
                  auVar75 = vpslld_avx(auVar81,0x17);
                  auVar75 = vpaddd_avx(auVar75,auVar73);
                  auVar49._0_4_ =
                       (fVar46 * fVar46 *
                        (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46
                          + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar4) + fVar46 + 1.0) *
                       auVar75._0_4_ + 1.0;
                  auVar49._4_4_ =
                       (fVar50 * fVar50 *
                        (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) * fVar50
                          + 0.041665796) * fVar50 + 0.16666666) * fVar50 + fVar5) + fVar50 + 1.0) *
                       auVar75._4_4_ + 1.0;
                  auVar49._8_4_ =
                       (fVar51 * fVar51 *
                        (((((fVar51 * 0.00019875691 + 0.0013981999) * fVar51 + 0.008333452) * fVar51
                          + 0.041665796) * fVar51 + 0.16666666) * fVar51 + fVar10) + fVar51 + 1.0) *
                       auVar75._8_4_ + 1.0;
                  auVar49._12_4_ =
                       (fVar52 * fVar52 *
                        (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52
                          + 0.041665796) * fVar52 + 0.16666666) * fVar52 + fVar11) + fVar52 + 1.0) *
                       auVar75._12_4_ + 1.0;
                  auVar47 = vdivps_avx(auVar73,auVar49);
                  break;
                case 5:
                  auVar72._8_4_ = 0x42b0c0a5;
                  auVar72._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar72._12_4_ = 0x42b0c0a5;
                  auVar75 = vminps_avx(auVar47,auVar72);
                  auVar82._8_4_ = 0xc2b0c0a5;
                  auVar82._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar82._12_4_ = 0xc2b0c0a5;
                  auVar12 = vmaxps_avx(auVar82,auVar75);
                  auVar83._0_4_ = auVar12._0_4_ * 1.442695 + fVar4;
                  auVar83._4_4_ = auVar12._4_4_ * 1.442695 + fVar5;
                  auVar83._8_4_ = auVar12._8_4_ * 1.442695 + fVar10;
                  auVar83._12_4_ = auVar12._12_4_ * 1.442695 + fVar11;
                  auVar85._0_4_ = (int)auVar83._0_4_;
                  auVar85._4_4_ = (int)auVar83._4_4_;
                  auVar85._8_4_ = (int)auVar83._8_4_;
                  auVar85._12_4_ = (int)auVar83._12_4_;
                  auVar84 = vcvtdq2ps_avx(auVar85);
                  auVar75 = vcmpps_avx(auVar83,auVar84,1);
                  auVar75 = vandps_avx(auVar75,auVar73);
                  auVar75 = vsubps_avx(auVar84,auVar75);
                  auVar86._0_4_ = auVar75._0_4_ * 0.6931472;
                  auVar86._4_4_ = auVar75._4_4_ * 0.6931472;
                  auVar86._8_4_ = auVar75._8_4_ * 0.6931472;
                  auVar86._12_4_ = auVar75._12_4_ * 0.6931472;
                  auVar84 = vsubps_avx(auVar12,auVar86);
                  fVar52 = auVar84._0_4_;
                  fVar60 = auVar84._4_4_;
                  fVar61 = auVar84._8_4_;
                  fVar62 = auVar84._12_4_;
                  auVar74._0_4_ = (int)auVar75._0_4_;
                  auVar74._4_4_ = (int)auVar75._4_4_;
                  auVar74._8_4_ = (int)auVar75._8_4_;
                  auVar74._12_4_ = (int)auVar75._12_4_;
                  auVar75 = vpslld_avx(auVar74,0x17);
                  auVar75 = vpaddd_avx(auVar75,auVar73);
                  auVar76._0_4_ =
                       (fVar52 + 1.0 +
                       fVar52 * fVar52 *
                       (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52
                         + 0.041665796) * fVar52 + 0.16666666) * fVar52 + fVar4)) * auVar75._0_4_ +
                       1.0;
                  auVar76._4_4_ =
                       (fVar60 + 1.0 +
                       fVar60 * fVar60 *
                       (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60
                         + 0.041665796) * fVar60 + 0.16666666) * fVar60 + fVar5)) * auVar75._4_4_ +
                       1.0;
                  auVar76._8_4_ =
                       (fVar61 + 1.0 +
                       fVar61 * fVar61 *
                       (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61
                         + 0.041665796) * fVar61 + 0.16666666) * fVar61 + fVar10)) * auVar75._8_4_ +
                       1.0;
                  auVar76._12_4_ =
                       (fVar62 + 1.0 +
                       fVar62 * fVar62 *
                       (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62
                         + 0.041665796) * fVar62 + 0.16666666) * fVar62 + fVar11)) * auVar75._12_4_
                       + 1.0;
                  auVar53._8_4_ = 0x800000;
                  auVar53._0_8_ = 0x80000000800000;
                  auVar53._12_4_ = 0x800000;
                  auVar75 = vmaxps_avx(auVar76,auVar53);
                  auVar84 = vpsrld_avx(auVar75,0x17);
                  auVar63._8_4_ = 0xffffff82;
                  auVar63._0_8_ = 0xffffff82ffffff82;
                  auVar63._12_4_ = 0xffffff82;
                  auVar84 = vpaddd_avx(auVar84,auVar63);
                  auVar64._8_4_ = 0x807fffff;
                  auVar64._0_8_ = 0x807fffff807fffff;
                  auVar64._12_4_ = 0x807fffff;
                  auVar75 = vandps_avx(auVar75,auVar64);
                  auVar56 = vorps_avx(auVar75,auVar45._0_16_);
                  auVar12 = vcvtdq2ps_avx(auVar84);
                  auVar65._8_4_ = 0x3f3504f3;
                  auVar65._0_8_ = 0x3f3504f33f3504f3;
                  auVar65._12_4_ = 0x3f3504f3;
                  auVar84 = vcmpps_avx(auVar56,auVar65,1);
                  auVar75 = vandps_avx(auVar84,auVar56);
                  fVar52 = auVar56._0_4_ + -1.0 + auVar75._0_4_;
                  fVar60 = auVar56._4_4_ + -1.0 + auVar75._4_4_;
                  fVar61 = auVar56._8_4_ + -1.0 + auVar75._8_4_;
                  fVar62 = auVar56._12_4_ + -1.0 + auVar75._12_4_;
                  auVar75 = vandps_avx(auVar84,auVar73);
                  auVar84 = vsubps_avx(auVar12,auVar75);
                  auVar75 = vcmpps_avx(auVar76,_DAT_005e2030,2);
                  auVar54._0_4_ =
                       (fVar52 * fVar52 *
                        (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) * fVar52
                              + -0.12420141) * fVar52 + 0.14249323) * fVar52 + -0.16668057) * fVar52
                           + 0.20000714) * fVar52 + -0.24999994) * fVar52 + 0.3333333) * fVar52 +
                        -0.5) + auVar84._0_4_ * 0.6931472 + fVar52) * -2.0;
                  auVar54._4_4_ =
                       (fVar60 * fVar60 *
                        (((((((((fVar60 * 0.070376836 + -0.1151461) * fVar60 + 0.116769984) * fVar60
                              + -0.12420141) * fVar60 + 0.14249323) * fVar60 + -0.16668057) * fVar60
                           + 0.20000714) * fVar60 + -0.24999994) * fVar60 + 0.3333333) * fVar60 +
                        -0.5) + auVar84._4_4_ * 0.6931472 + fVar60) * -2.0;
                  auVar54._8_4_ =
                       (fVar61 * fVar61 *
                        (((((((((fVar61 * 0.070376836 + -0.1151461) * fVar61 + 0.116769984) * fVar61
                              + -0.12420141) * fVar61 + 0.14249323) * fVar61 + -0.16668057) * fVar61
                           + 0.20000714) * fVar61 + -0.24999994) * fVar61 + 0.3333333) * fVar61 +
                        -0.5) + auVar84._8_4_ * 0.6931472 + fVar61) * -2.0;
                  auVar54._12_4_ =
                       (fVar62 * fVar62 *
                        (((((((((fVar62 * 0.070376836 + -0.1151461) * fVar62 + 0.116769984) * fVar62
                              + -0.12420141) * fVar62 + 0.14249323) * fVar62 + -0.16668057) * fVar62
                           + 0.20000714) * fVar62 + -0.24999994) * fVar62 + 0.3333333) * fVar62 +
                        -0.5) + auVar84._12_4_ * 0.6931472 + fVar62) * -2.0;
                  auVar66._8_4_ = 0x7fffffff;
                  auVar66._0_8_ = 0x7fffffff7fffffff;
                  auVar66._12_4_ = 0x7fffffff;
                  auVar75 = vblendvps_avx(auVar54,auVar66,auVar75);
                  auVar67._8_4_ = 0x42b0c0a5;
                  auVar67._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar67._12_4_ = 0x42b0c0a5;
                  auVar75 = vminps_avx(auVar75,auVar67);
                  auVar68._8_4_ = 0xc2b0c0a5;
                  auVar68._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar68._12_4_ = 0xc2b0c0a5;
                  auVar12 = vmaxps_avx(auVar75,auVar68);
                  auVar69._0_4_ = auVar12._0_4_ * 1.442695 + fVar4;
                  auVar69._4_4_ = auVar12._4_4_ * 1.442695 + fVar5;
                  auVar69._8_4_ = auVar12._8_4_ * 1.442695 + fVar10;
                  auVar69._12_4_ = auVar12._12_4_ * 1.442695 + fVar11;
                  auVar77._0_4_ = (int)auVar69._0_4_;
                  auVar77._4_4_ = (int)auVar69._4_4_;
                  auVar77._8_4_ = (int)auVar69._8_4_;
                  auVar77._12_4_ = (int)auVar69._12_4_;
                  auVar84 = vcvtdq2ps_avx(auVar77);
                  auVar75 = vcmpps_avx(auVar69,auVar84,1);
                  auVar75 = vandps_avx(auVar75,auVar73);
                  auVar75 = vsubps_avx(auVar84,auVar75);
                  auVar78._0_4_ = auVar75._0_4_ * 0.6931472;
                  auVar78._4_4_ = auVar75._4_4_ * 0.6931472;
                  auVar78._8_4_ = auVar75._8_4_ * 0.6931472;
                  auVar78._12_4_ = auVar75._12_4_ * 0.6931472;
                  auVar84 = vsubps_avx(auVar12,auVar78);
                  fVar52 = auVar84._0_4_;
                  fVar60 = auVar84._4_4_;
                  fVar61 = auVar84._8_4_;
                  fVar62 = auVar84._12_4_;
                  auVar45 = ZEXT1664(auVar45._0_16_);
                  auVar70._0_4_ = (int)auVar75._0_4_;
                  auVar70._4_4_ = (int)auVar75._4_4_;
                  auVar70._8_4_ = (int)auVar75._8_4_;
                  auVar70._12_4_ = (int)auVar75._12_4_;
                  auVar75 = vpslld_avx(auVar70,0x17);
                  auVar75 = vpaddd_avx(auVar75,auVar73);
                  auVar55._0_4_ =
                       (fVar52 + 1.0 +
                       (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52
                         + 0.041665796) * fVar52 + 0.16666666) * fVar52 + fVar4) * fVar52 * fVar52)
                       * auVar75._0_4_ + 1.0;
                  auVar55._4_4_ =
                       (fVar60 + 1.0 +
                       (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60
                         + 0.041665796) * fVar60 + 0.16666666) * fVar60 + fVar5) * fVar60 * fVar60)
                       * auVar75._4_4_ + 1.0;
                  auVar55._8_4_ =
                       (fVar61 + 1.0 +
                       (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61
                         + 0.041665796) * fVar61 + 0.16666666) * fVar61 + fVar10) * fVar61 * fVar61)
                       * auVar75._8_4_ + 1.0;
                  auVar55._12_4_ =
                       (fVar62 + 1.0 +
                       (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62
                         + 0.041665796) * fVar62 + 0.16666666) * fVar62 + fVar11) * fVar62 * fVar62)
                       * auVar75._12_4_ + 1.0;
                  auVar71._8_4_ = 0x40000000;
                  auVar71._0_8_ = 0x4000000040000000;
                  auVar71._12_4_ = 0x40000000;
                  auVar75 = vdivps_avx(auVar71,auVar55);
                  auVar56._0_4_ = auVar75._0_4_ + -1.0;
                  auVar56._4_4_ = auVar75._4_4_ + -1.0;
                  auVar56._8_4_ = auVar75._8_4_ + -1.0;
                  auVar56._12_4_ = auVar75._12_4_ + -1.0;
                  goto LAB_00419f24;
                case 6:
                  pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                  fVar4 = *pfVar1;
                  fVar5 = pfVar1[1];
                  auVar59._0_4_ = fVar4 * auVar47._0_4_ + fVar5;
                  auVar59._4_4_ = fVar4 * fVar46 + fVar5;
                  auVar59._8_4_ = fVar4 * fVar50 + fVar5;
                  auVar59._12_4_ = fVar4 * fVar51 + fVar5;
                  auVar75 = vmaxps_avx(auVar59,_DAT_005e2030);
                  auVar56 = vminps_avx(auVar75,auVar73);
LAB_00419f24:
                  auVar47._0_4_ = auVar56._0_4_ * auVar47._0_4_;
                  auVar47._4_4_ = auVar56._4_4_ * fVar46;
                  auVar47._8_4_ = auVar56._8_4_ * fVar50;
                  auVar47._12_4_ = auVar56._12_4_ * fVar51;
                }
                *(undefined1 (*) [16])((long)pvVar42 + uVar40 * 0x10) = auVar47;
                uVar40 = uVar40 + 1;
              } while (uVar40 != _w);
            }
            pvVar42 = (void *)((long)pvVar42 + (long)(int)(_w * 4) * 4);
            bVar43 = iVar27 != iVar41;
            iVar27 = iVar27 + 1;
          } while (bVar43);
        }
        local_228 = local_228 + 1;
        iVar30 = iVar30 + uVar33 * 4;
      } while (local_228 != uVar25);
    }
LAB_0041a1c6:
    if ((pointer)local_168._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
    }
  }
  iVar29 = 0;
LAB_0041a355:
  piVar6 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((pointer)local_1b8.data != (pointer)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_1b8.allocator + 0x18))();
      }
    }
  }
  return iVar29;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}